

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall kj::ArrayBuilder<kj::String>::clear(ArrayBuilder<kj::String> *this)

{
  char *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  RemoveConst<kj::String> *pRVar4;
  
  pRVar4 = this->pos;
  if (this->ptr < pRVar4) {
    do {
      this->pos = pRVar4 + -1;
      pcVar1 = pRVar4[-1].content.ptr;
      if (pcVar1 != (char *)0x0) {
        sVar2 = pRVar4[-1].content.size_;
        pRVar4[-1].content.ptr = (char *)0x0;
        pRVar4[-1].content.size_ = 0;
        pAVar3 = pRVar4[-1].content.disposer;
        (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar1,1,sVar2,sVar2,0);
      }
      pRVar4 = this->pos;
    } while (this->ptr < pRVar4);
  }
  return;
}

Assistant:

void clear() {
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(ptr);
    } else {
      while (pos > ptr) {
        kj::dtor(*--pos);
      }
    }
  }